

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O0

void CoreMLConverter::unsupportedCaffeParrameterWithOption
               (string *parameterName,string *layerName,string *layerType,string *optionName)

{
  ostream *poVar1;
  runtime_error *this;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  string *local_28;
  string *optionName_local;
  string *layerType_local;
  string *layerName_local;
  string *parameterName_local;
  
  local_28 = optionName;
  optionName_local = layerType;
  layerType_local = layerName;
  layerName_local = parameterName;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"Unsupported option \'");
  poVar1 = std::operator<<(poVar1,(string *)local_28);
  poVar1 = std::operator<<(poVar1,"\' for the parameter \'");
  poVar1 = std::operator<<(poVar1,(string *)layerName_local);
  poVar1 = std::operator<<(poVar1,"\' in layer \'");
  poVar1 = std::operator<<(poVar1,(string *)layerType_local);
  poVar1 = std::operator<<(poVar1,"\' of type \'");
  poVar1 = std::operator<<(poVar1,(string *)optionName_local);
  poVar1 = std::operator<<(poVar1,"\' during caffe conversion.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this,local_1e0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void unsupportedCaffeParrameterWithOption(const std::string& parameterName,
                                                   const std::string& layerName,
                                                   const std::string& layerType,
                                                   const std::string& optionName) {
        
        std::stringstream ss;
        ss << "Unsupported option '" << optionName << "' for the parameter '"
           << parameterName << "' in layer '"<< layerName<< "' of type '" << layerType<< "' during caffe conversion."
           << std::endl;
        throw std::runtime_error(ss.str());
    }